

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR xpath_current(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  uint uVar1;
  int iVar2;
  LY_ERR LVar3;
  long lVar4;
  lyxp_node_type lVar5;
  undefined4 uVar6;
  lysc_node *node;
  lyd_node *node_00;
  
  if (args == (lyxp_set **)0x0 && arg_count == 0) {
    if ((options & 0x1c) == 0) {
      lyxp_set_free_content(set);
      node_00 = (set->field_10).cur_node;
      if (node_00 == (lyd_node *)0x0) {
        lVar5 = set->root_type;
        node_00 = (lyd_node *)0x0;
      }
      else {
        lVar5 = LYXP_NODE_ELEM;
      }
      set_insert_node(set,node_00,0,lVar5,0);
    }
    else {
      uVar1 = set->used;
      if ((ulong)uVar1 != 0) {
        lVar4 = 0;
        do {
          iVar2 = *(int *)((long)&((set->val).nodes)->pos + lVar4);
          uVar6 = 0;
          if (iVar2 == 2) {
LAB_001b5cdc:
            *(undefined4 *)((long)&((set->val).nodes)->pos + lVar4) = uVar6;
          }
          else if (iVar2 == -2) {
            uVar6 = 0xffffffff;
            goto LAB_001b5cdc;
          }
          lVar4 = lVar4 + 0x18;
        } while ((ulong)uVar1 * 0x18 != lVar4);
      }
      node = (set->field_10).cur_scnode;
      if (node == (lysc_node *)0x0) {
        lVar5 = set->root_type;
        node = (lysc_node *)0x0;
      }
      else {
        lVar5 = LYXP_NODE_ELEM;
      }
      LVar3 = lyxp_set_scnode_insert_node(set,node,lVar5,LYXP_AXIS_SELF,(uint32_t *)0x0);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
    }
    LVar3 = LY_SUCCESS;
  }
  else {
    ly_vlog(set->ctx,(char *)0x0,LYVE_XPATH,
            "Invalid number of arguments (%u) for the XPath function %.*s.",(ulong)arg_count,9,
            "current()");
    LVar3 = LY_EVALID;
  }
  return LVar3;
}

Assistant:

static LY_ERR
xpath_current(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    if (arg_count || args) {
        LOGVAL(set->ctx, LY_VCODE_XP_INARGCOUNT, arg_count, LY_PRI_LENSTR("current()"));
        return LY_EVALID;
    }

    if (options & LYXP_SCNODE_ALL) {
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_NODE);

        if (set->cur_scnode) {
            LY_CHECK_RET(lyxp_set_scnode_insert_node(set, set->cur_scnode, LYXP_NODE_ELEM, LYXP_AXIS_SELF, NULL));
        } else {
            /* root node */
            LY_CHECK_RET(lyxp_set_scnode_insert_node(set, NULL, set->root_type, LYXP_AXIS_SELF, NULL));
        }
    } else {
        lyxp_set_free_content(set);

        if (set->cur_node) {
            /* position is filled later */
            set_insert_node(set, set->cur_node, 0, LYXP_NODE_ELEM, 0);
        } else {
            /* root node */
            set_insert_node(set, NULL, 0, set->root_type, 0);
        }
    }

    return LY_SUCCESS;
}